

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall QListView::visualIndex(QListView *this,QModelIndex *index)

{
  QListViewPrivate *this_00;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  piter local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  uint local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  QListViewPrivate::indexToListViewItem((QListViewItem *)&local_48,this_00,index);
  iVar1 = (*this_00->commonListView->_vptr_QCommonListViewBase[2])
                    (this_00->commonListView,(QListViewItem *)&local_48);
  local_58 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin
                              (&(this_00->hiddenRows).q_hash);
  while( true ) {
    if (local_58.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
        local_58.bucket == 0) break;
    iVar2 = QPersistentModelIndex::row();
    iVar1 = iVar1 - (uint)(iVar2 <= index->r);
    QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::operator++
              (&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QListView::visualIndex(const QModelIndex &index) const
{
    Q_D(const QListView);
    d->executePostedLayout();
    QListViewItem itm = d->indexToListViewItem(index);
    int visualIndex = d->commonListView->itemIndex(itm);
    for (const auto &idx : std::as_const(d->hiddenRows)) {
        if (idx.row() <= index.row())
            --visualIndex;
    }
    return visualIndex;
}